

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ConsumeInteger(Parser *this,int *output,ErrorMaker error)

{
  TokenType TVar1;
  bool bVar2;
  uint64_t value;
  uint64_t local_20;
  
  TVar1 = (this->input_->current_).type;
  if (TVar1 == TYPE_INTEGER) {
    local_20 = 0;
    bVar2 = io::Tokenizer::ParseInteger(&(this->input_->current_).text,0x7fffffff,&local_20);
    if (!bVar2) {
      RecordError(this,(ErrorMaker)ZEXT816(0x371ec2));
    }
    *output = (int)local_20;
    io::Tokenizer::Next(this->input_);
  }
  else {
    RecordError(this,error);
  }
  return TVar1 == TYPE_INTEGER;
}

Assistant:

bool Parser::ConsumeInteger(int* output, ErrorMaker error) {
  if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
    uint64_t value = 0;
    if (!io::Tokenizer::ParseInteger(input_->current().text,
                                     std::numeric_limits<int32_t>::max(),
                                     &value)) {
      RecordError("Integer out of range.");
      // We still return true because we did, in fact, parse an integer.
    }
    *output = value;
    input_->Next();
    return true;
  } else {
    RecordError(error);
    return false;
  }
}